

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

ChromeCompositorStateMachine * __thiscall
perfetto::protos::gen::ChromeCompositorStateMachine::operator=
          (ChromeCompositorStateMachine *this,ChromeCompositorStateMachine *param_1)

{
  ChromeCompositorStateMachine *param_1_local;
  ChromeCompositorStateMachine *this_local;
  
  protozero::CppMessageObj::operator=(&this->super_CppMessageObj,&param_1->super_CppMessageObj);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeCompositorStateMachine_MajorState>::operator=
            (&this->major_state_,&param_1->major_state_);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeCompositorStateMachine_MinorState>::operator=
            (&this->minor_state_,&param_1->minor_state_);
  ::std::__cxx11::string::operator=
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return this;
}

Assistant:

ChromeCompositorStateMachine::ChromeCompositorStateMachine(ChromeCompositorStateMachine&&) noexcept = default;